

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

CustomLayerParams * __thiscall
CoreML::Specification::CustomLayerParams::New(CustomLayerParams *this,Arena *arena)

{
  CustomLayerParams *this_00;
  
  this_00 = (CustomLayerParams *)operator_new(0x60);
  CustomLayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::CustomLayerParams>(arena,this_00);
  }
  return this_00;
}

Assistant:

CustomLayerParams* CustomLayerParams::New(::google::protobuf::Arena* arena) const {
  CustomLayerParams* n = new CustomLayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}